

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jemalloc.c
# Opt level: O0

void je_malloc_stats_print(_func_void_void_ptr_char_ptr *write_cb,void *cbopaque,char *opts)

{
  long *in_FS_OFFSET;
  tsdn_t *tsdn;
  tsd_t *tsd;
  _Bool in_stack_ffffffffffffff8f;
  tsd_t *in_stack_ffffffffffffff90;
  tsd_t *in_stack_ffffffffffffffe0;
  undefined7 in_stack_ffffffffffffffe8;
  undefined1 in_stack_ffffffffffffffef;
  tsd_t *in_stack_fffffffffffffff0;
  tsd_t *write_cb_00;
  
  write_cb_00 = in_stack_fffffffffffffff0;
  if (tsd_booted) {
    in_stack_ffffffffffffffef = 0;
    in_stack_ffffffffffffffe0 = (tsd_t *)*in_FS_OFFSET;
    write_cb_00 = in_stack_ffffffffffffffe0;
    if ((in_stack_ffffffffffffffe0->state).repr != '\0') {
      in_stack_ffffffffffffffe0 =
           tsd_fetch_slow(in_stack_ffffffffffffff90,in_stack_ffffffffffffff8f);
      write_cb_00 = in_stack_fffffffffffffff0;
    }
  }
  stats_print((_func_void_void_ptr_char_ptr *)write_cb_00,
              (void *)CONCAT17(in_stack_ffffffffffffffef,in_stack_ffffffffffffffe8),
              (char *)in_stack_ffffffffffffffe0);
  return;
}

Assistant:

JEMALLOC_NOTHROW
je_malloc_stats_print(void (*write_cb)(void *, const char *), void *cbopaque,
    const char *opts) {
	tsdn_t *tsdn;

	LOG("core.malloc_stats_print.entry", "");

	tsdn = tsdn_fetch();
	check_entry_exit_locking(tsdn);
	stats_print(write_cb, cbopaque, opts);
	check_entry_exit_locking(tsdn);
	LOG("core.malloc_stats_print.exit", "");
}